

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_init(BuildCtx *ctx,int maxsection)

{
  ulong uVar1;
  dasm_State *pdVar2;
  dasm_Section *pdVar3;
  ulong __size;
  long lVar4;
  
  ctx->D = (dasm_State *)0x0;
  uVar1 = 0x10;
  do {
    __size = uVar1;
    uVar1 = __size * 2;
  } while (__size < (long)(maxsection + -1) * 0x28 + 0x78U);
  pdVar2 = (dasm_State *)malloc(__size);
  ctx->D = pdVar2;
  if (pdVar2 != (dasm_State *)0x0) {
    pdVar2->psize = __size;
    pdVar2->lglabels = (int *)0x0;
    pdVar2->lgsize = 0;
    pdVar2->pclabels = (int *)0x0;
    pdVar2->pcsize = 0;
    pdVar2->globals = (void **)0x0;
    pdVar2->maxsection = maxsection;
    if (0 < maxsection) {
      pdVar3 = pdVar2->sections;
      lVar4 = 0;
      do {
        pdVar3->buf = (int *)0x0;
        pdVar3->bsize = 0;
        pdVar3->rbuf = (int *)((long)(int)lVar4 * -4);
        pdVar3->epos = 0;
        lVar4 = lVar4 + 0x1000000;
        pdVar3 = pdVar3 + 1;
      } while ((ulong)(uint)maxsection << 0x18 != lVar4);
    }
    return;
  }
  exit(1);
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  int i;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  for (i = 0; i < maxsection; i++) {
    D->sections[i].buf = NULL;  /* Need this for pass3. */
    D->sections[i].rbuf = D->sections[i].buf - DASM_SEC2POS(i);
    D->sections[i].bsize = 0;
    D->sections[i].epos = 0;  /* Wrong, but is recalculated after resize. */
  }
}